

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

void __thiscall slang::ast::Scope::addMembers(Scope *this,SyntaxNode *syntax)

{
  SyntaxKind SVar1;
  SyntaxNode *pSVar2;
  undefined1 auVar3 [16];
  pointer ppSVar4;
  bool bVar5;
  int iVar6;
  ConfigBlockSymbol *member;
  uint *puVar7;
  DeferredMemberData *pDVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  ExplicitImportSymbol *this_00;
  SourceLocation SVar10;
  string_view *psVar11;
  CovergroupType *member_00;
  ulong uVar12;
  int *in_RDX;
  int *extraout_RDX;
  Scope *unaff_RBX;
  char *pcVar13;
  SmallVector<slang::ast::VariableSymbol_*,_5UL> *__range3;
  undefined8 *puVar14;
  undefined8 *puVar15;
  ElabSystemTaskSyntax *syntax_00;
  Compilation *compilation;
  Token *this_01;
  long unaff_R12;
  long lVar16;
  long lVar17;
  Scope *unaff_R13;
  PackageImportDeclarationSyntax *importDecl;
  ForwardingTypedefSymbol *unaff_R15;
  LookupLocation location;
  pair<slang::ast::SubroutineSymbol_*,_bool> pVar18;
  Token TVar19;
  SmallVector<slang::ast::VariableSymbol_*,_5UL> symbols;
  SmallVectorBase<const_slang::ast::SpecparamSymbol_*> local_98 [2];
  string_view local_58;
  SyntaxNode *local_48;
  SourceLocation local_40;
  Compilation *local_38;
  
  puVar14 = &local_98[0].data_;
  puVar15 = &local_98[0].data_;
  syntax_00 = (ElabSystemTaskSyntax *)syntax->previewNode;
  compilation = (Compilation *)this;
  if (syntax_00 != (ElabSystemTaskSyntax *)0x0) {
    addMembers(this,(SyntaxNode *)syntax_00);
    in_RDX = extraout_RDX;
  }
  SVar1 = syntax->kind;
  puVar7 = (uint *)(ulong)SVar1;
  if ((int)SVar1 < 0xcb) {
    if (0x43 < (int)SVar1) {
switchD_00861040_caseD_81:
      iVar6 = (int)puVar7;
      if (iVar6 < 0xa4) goto code_r0x0086102f;
      if (iVar6 == 0xa4) {
        compilation = this->compilation;
        syntax_00 = (ElabSystemTaskSyntax *)syntax;
        goto switchD_00861040_caseD_94;
      }
      if (iVar6 != 0xae) {
        addDeferredMembers(this,syntax);
        pDVar8 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
        pDVar8->hasEnums = true;
        return;
      }
      member = (ConfigBlockSymbol *)
               EmptyMemberSymbol::fromSyntax(this->compilation,this,(EmptyMemberSyntax *)syntax);
      goto LAB_00861182;
    }
    if (0xf < (int)SVar1) {
      if (((int)SVar1 < 0x34) || (SVar1 != BinsSelection)) goto switchD_008611c4_caseD_142;
      member = (ConfigBlockSymbol *)
               CoverageBinSymbol::fromSyntax(this,(BinsSelectionSyntax *)syntax);
      goto LAB_00861182;
    }
    if (3 < SVar1 - AlwaysBlock) {
      member = (ConfigBlockSymbol *)
               AnonymousProgramSymbol::fromSyntax(this,(AnonymousProgramSyntax *)syntax);
      goto LAB_00861182;
    }
switchD_00861112_caseD_cf:
    member = (ConfigBlockSymbol *)
             ProceduralBlockSymbol::fromSyntax(this,(ProceduralBlockSyntax *)syntax);
    goto LAB_00861182;
  }
  if ((int)SVar1 < 0x157) {
    if ((int)SVar1 < 0xee) {
      puVar7 = &switchD_00861112::switchdataD_00a447e4;
      switch(SVar1) {
      case ExternInterfaceMethod:
        member = (ConfigBlockSymbol *)
                 MethodPrototypeSymbol::fromSyntax(this,(ExternInterfaceMethodSyntax *)syntax);
        break;
      case ExternModuleDecl:
      case ExternUdpDecl:
        Compilation::noteExternDefinition(this->compilation,this,syntax);
        return;
      case FilePathSpec:
      case FirstMatchSequenceExpr:
      case FollowedByPropertyExpr:
      case ForLoopStatement:
      case ForVariableDeclaration:
      case ForeachLoopList:
      case ForeachLoopStatement:
      case ForeverStatement:
      case ForwardTypeRestriction:
      case FunctionPort:
      case FunctionPortList:
      case FunctionPrototype:
      case GreaterThanEqualExpression:
      case GreaterThanExpression:
      case HierarchicalInstance:
switchD_008611c4_caseD_144:
        if ((ForwardingTypedefSymbol *)local_98[0].data_ != unaff_R15) {
          operator_delete(local_98[0].data_);
        }
        _Unwind_Resume(puVar7);
      case FinalBlock:
        goto switchD_00861112_caseD_cf;
      case ForwardTypedefDeclaration:
        local_98[0].data_ =
             (pointer)ForwardingTypedefSymbol::fromSyntax
                                (this,(ForwardTypedefDeclarationSyntax *)syntax);
LAB_0086197f:
        insertMember(this,(Symbol *)local_98[0].data_,this->lastMember,false,true);
        pDVar8 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
        std::
        vector<slang::ast::ForwardingTypedefSymbol_const*,std::allocator<slang::ast::ForwardingTypedefSymbol_const*>>
        ::emplace_back<slang::ast::ForwardingTypedefSymbol_const*>
                  ((vector<slang::ast::ForwardingTypedefSymbol_const*,std::allocator<slang::ast::ForwardingTypedefSymbol_const*>>
                    *)&pDVar8->forwardingTypedefs,(ForwardingTypedefSymbol **)local_98);
        return;
      case FunctionDeclaration:
switchD_00861112_caseD_d9:
        pVar18 = SubroutineSymbol::fromSyntax
                           (this->compilation,(FunctionDeclarationSyntax *)syntax,this,false);
        if (pVar18.first != (SubroutineSymbol *)0x0) {
          insertMember(this,&(pVar18.first)->super_Symbol,this->lastMember,false,true);
        }
        if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return;
        }
        pDVar8 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
        pDVar8->isUncacheable = true;
        return;
      case GenerateBlock:
      case HierarchyInstantiation:
        goto switchD_008611c4_caseD_142;
      case GenerateRegion:
        lVar17 = *(long *)(syntax + 6);
        if (lVar17 == 0) {
          return;
        }
        pSVar2 = syntax[5].previewNode;
        lVar16 = 0;
        do {
          addMembers(this,*(SyntaxNode **)((long)&pSVar2->kind + lVar16));
          lVar16 = lVar16 + 8;
        } while (lVar17 << 3 != lVar16);
        return;
      case GenvarDeclaration:
        unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
        local_98[0].len = 0;
        local_98[0].data_ = (pointer)unaff_R15;
        local_98[0].cap = 5;
        GenvarSymbol::fromSyntax
                  (this,(GenvarDeclarationSyntax *)syntax,
                   (SmallVectorBase<const_slang::ast::GenvarSymbol_*> *)local_98);
        ppSVar4 = local_98[0].data_;
        puVar15 = &local_98[0].data_;
        syntax = (SyntaxNode *)local_98[0].data_;
        if ((char *)local_98[0].len == (char *)0x0) goto LAB_00861b62;
        lVar17 = local_98[0].len << 3;
        lVar16 = 0;
        do {
          insertMember(this,*(Symbol **)((long)&((Symbol *)ppSVar4)->kind + lVar16),this->lastMember
                       ,false,true);
          lVar16 = lVar16 + 8;
          puVar14 = &local_98[0].data_;
        } while (lVar17 != lVar16);
        goto LAB_00861b5e;
      default:
        if (SVar1 == IfGenerate) goto switchD_008611c4_caseD_142;
        member = (ConfigBlockSymbol *)
                 TimingPathSymbol::fromSyntax(this,(IfNonePathDeclarationSyntax *)syntax);
      }
LAB_00861182:
      insertMember(this,&member->super_Symbol,this->lastMember,false,true);
      return;
    }
code_r0x00860fdf:
    iVar6 = (int)puVar7;
    if (iVar6 < 0x12d) {
      if (0x10b < iVar6) {
        if (0x10e < iVar6) {
          if (iVar6 == 0x10f) {
            return;
          }
          goto switchD_008611c4_caseD_142;
        }
        if (iVar6 != 0x10c) {
          return;
        }
        member = (ConfigBlockSymbol *)LetDeclSymbol::fromSyntax(this,(LetDeclarationSyntax *)syntax)
        ;
        goto LAB_00861182;
      }
      if (iVar6 == 0xee) {
        member = (ConfigBlockSymbol *)
                 ProceduralBlockSymbol::fromSyntax(this,(ImmediateAssertionMemberSyntax *)syntax);
        goto LAB_00861182;
      }
      if (iVar6 == 0xfb) goto switchD_00861112_caseD_cf;
    }
    else {
      puVar7 = &switchD_008611c4::switchdataD_00a44848;
      switch(iVar6) {
      case 0x142:
      case 0x149:
        goto switchD_008611c4_caseD_142;
      case 0x143:
        unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
        local_98[0].len = 0;
        local_98[0].data_ = (pointer)unaff_R15;
        local_98[0].cap = 5;
        NetSymbol::fromSyntax
                  (this,(NetDeclarationSyntax *)syntax,
                   (SmallVectorBase<const_slang::ast::NetSymbol_*> *)local_98);
        ppSVar4 = local_98[0].data_;
        puVar15 = &local_98[0].data_;
        syntax = (SyntaxNode *)local_98[0].data_;
        if ((char *)local_98[0].len == (char *)0x0) goto LAB_00861b62;
        lVar17 = local_98[0].len << 3;
        lVar16 = 0;
        do {
          insertMember(this,*(Symbol **)((long)&((Symbol *)ppSVar4)->kind + lVar16),this->lastMember
                       ,false,true);
          lVar16 = lVar16 + 8;
        } while (lVar17 != lVar16);
        goto LAB_00861b5e;
      case 0x144:
      case 0x146:
      case 0x147:
      case 0x148:
        goto switchD_008611c4_caseD_144;
      case 0x145:
switchD_008611c4_caseD_145:
        member = (ConfigBlockSymbol *)NetType::fromSyntax(this,(NetTypeDeclarationSyntax *)syntax);
        goto LAB_00861182;
      default:
        if (iVar6 == 0x12d) goto switchD_008611c4_caseD_142;
      }
    }
  }
  else {
    if (0x183 < (int)SVar1) {
      if (0x1ca < (int)SVar1) {
        if (0x1de < (int)SVar1) {
          if (SVar1 != UdpDeclaration) {
            if (SVar1 != UserDefinedNetDeclaration) {
              return;
            }
            handleUserDefinedNet(this,(UserDefinedNetDeclarationSyntax *)syntax);
            return;
          }
LAB_0086171a:
          Compilation::createPrimitive(this->compilation,this,(UdpDeclarationSyntax *)syntax);
          return;
        }
        if (SVar1 == TaskDeclaration) goto switchD_00861112_caseD_d9;
        if (SVar1 == TimeUnitsDeclaration) {
          return;
        }
        member = (ConfigBlockSymbol *)
                 TypeAliasType::fromSyntax(this,(TypedefDeclarationSyntax *)syntax);
        goto LAB_00861182;
      }
      if ((int)SVar1 < 0x1b3) {
        if (SVar1 == PulseStyleDeclaration) {
          member = (ConfigBlockSymbol *)
                   PulseStyleSymbol::fromSyntax(this,(PulseStyleDeclarationSyntax *)syntax);
        }
        else {
          member = (ConfigBlockSymbol *)
                   SequenceSymbol::fromSyntax(this,(SequenceDeclarationSyntax *)syntax);
        }
        goto LAB_00861182;
      }
      if (SVar1 == SpecifyBlock) goto switchD_008611c4_caseD_142;
      if (SVar1 != SpecparamDeclaration) {
        member = (ConfigBlockSymbol *)
                 SystemTimingCheckSymbol::fromSyntax(this,(SystemTimingCheckSyntax *)syntax);
        goto LAB_00861182;
      }
      unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
      local_98[0].len = 0;
      local_98[0].data_ = (pointer)unaff_R15;
      local_98[0].cap = 5;
      SpecparamSymbol::fromSyntax(this,(SpecparamDeclarationSyntax *)syntax,local_98);
      pcVar13 = (char *)local_98[0].len;
      puVar15 = &local_98[0].data_;
      syntax = (SyntaxNode *)local_98[0].data_;
      if ((char *)local_98[0].len == (char *)0x0) goto LAB_00861b62;
code_r0x00861286:
      lVar17 = 0;
      do {
        insertMember(this,*(Symbol **)
                           ((long)&(((ForwardingTypedefSymbol *)syntax)->super_Symbol).kind + lVar17
                           ),this->lastMember,false,true);
        lVar17 = lVar17 + 8;
        puVar14 = &local_98[0].data_;
      } while ((long)pcVar13 * 8 != lVar17);
      goto LAB_00861b5e;
    }
    if ((int)SVar1 < 0x16b) {
      (*(code *)((long)&UINT_00a44868 + (long)(int)(&UINT_00a44868)[SVar1 - PackageDeclaration]))();
      return;
    }
    if ((int)SVar1 < 0x176) {
      if (SVar1 != PathDeclaration) {
        addDeferredMembers(this,syntax);
        pDVar8 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
        local_98[0].data_ = (pointer)this->lastMember;
        local_58._M_len = (size_t)syntax;
        std::
        vector<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>>>
        ::emplace_back<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*&>
                  ((vector<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>>>
                    *)&pDVar8->portDecls,(SyntaxNode **)&local_58,(Symbol **)local_98);
        return;
      }
      member = (ConfigBlockSymbol *)
               TimingPathSymbol::fromSyntax(this,(PathDeclarationSyntax *)syntax);
      goto LAB_00861182;
    }
    if (SVar1 == PrimitiveInstantiation) goto switchD_008611c4_caseD_142;
    if (SVar1 != ProgramDeclaration) {
      member = (ConfigBlockSymbol *)
               PropertySymbol::fromSyntax(this,(PropertyDeclarationSyntax *)syntax);
      goto LAB_00861182;
    }
  }
  if (this->lastMember == (Symbol *)0x0) {
    uVar12 = 1;
  }
  else {
    uVar12 = (ulong)(this->lastMember->indexInScope + 1);
  }
  location._8_8_ = uVar12;
  location.scope = this;
  Compilation::createDefinition(this->compilation,this,location,(ModuleDeclarationSyntax *)syntax);
  if ((this->thisSym->kind | Definition) == CompilationUnit) {
    return;
  }
  if (syntax->kind == InterfaceDeclaration) {
    return;
  }
switchD_008611c4_caseD_142:
  addDeferredMembers(this,syntax);
  return;
switchD_00861040_caseD_44:
  unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
  local_98[0].len = 0;
  local_98[0].data_ = (pointer)unaff_R15;
  local_98[0].cap = 5;
  VariableSymbol::fromSyntax
            (this->compilation,*(DataDeclarationSyntax **)(syntax + 4),this,true,
             (SmallVectorBase<slang::ast::VariableSymbol_*> *)local_98);
  pcVar13 = (char *)local_98[0].len;
  syntax = (SyntaxNode *)local_98[0].data_;
code_r0x0086107c:
  puVar15 = &local_98[0].data_;
  if (pcVar13 == (char *)0x0) goto LAB_00861b62;
  unaff_RBX = (Scope *)((long)pcVar13 << 3);
code_r0x00861089:
  lVar17 = 0;
  do {
    insertMember(this,*(Symbol **)
                       ((long)&(((ForwardingTypedefSymbol *)syntax)->super_Symbol).kind + lVar17),
                 this->lastMember,false,true);
    lVar17 = lVar17 + 8;
    puVar14 = &local_98[0].data_;
  } while (unaff_RBX != (Scope *)lVar17);
  goto LAB_00861b5e;
code_r0x0086102f:
  puVar7 = (uint *)((long)&switchD_00861040::switchdataD_00a446f4 +
                   (long)(int)(&switchD_00861040::switchdataD_00a446f4)[iVar6 - 0x44]);
  lVar17 = unaff_R12;
  switch(iVar6) {
  case 0x44:
    goto switchD_00861040_caseD_44;
  case 0x45:
    member = (ConfigBlockSymbol *)CheckerSymbol::fromSyntax(this,(CheckerDeclarationSyntax *)syntax)
    ;
    goto LAB_00861182;
  default:
    goto switchD_008611c4_caseD_144;
  case 0x47:
  case 0x4e:
  case 0x50:
  case 0x68:
  case 0x6a:
  case 0x7b:
  case 0x7f:
    goto switchD_008611c4_caseD_142;
  case 0x48:
    member = (ConfigBlockSymbol *)ClassType::fromSyntax(this,(ClassDeclarationSyntax *)syntax);
    goto LAB_00861182;
  case 0x49:
    TVar19 = slang::syntax::SyntaxNode::getLastToken
                       (*(SyntaxNode **)(syntax[5].previewNode[3].parent + 5));
    if (TVar19.kind == NewKeyword) goto switchD_008611c4_caseD_142;
    member = (ConfigBlockSymbol *)
             SubroutineSymbol::fromSyntax
                       (this->compilation,(ClassMethodDeclarationSyntax *)syntax,this);
    goto LAB_00861baf;
  case 0x4a:
    member = (ConfigBlockSymbol *)
             MethodPrototypeSymbol::fromSyntax(this,(ClassMethodPrototypeSyntax *)syntax);
    goto LAB_00861182;
  case 0x4c:
    SVar1 = (((ParameterDeclarationStatementSyntax *)syntax[5].previewNode)->super_MemberSyntax).
            super_SyntaxNode.kind;
    if ((int)SVar1 < 0x15f) {
      if (SVar1 != DataDeclaration) {
        if (SVar1 != ForwardTypedefDeclaration) {
          return;
        }
        local_98[0].data_ =
             (pointer)ForwardingTypedefSymbol::fromSyntax
                                (this,(ClassPropertyDeclarationSyntax *)syntax);
        goto LAB_0086197f;
      }
      unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
      local_98[0].len = 0;
      local_98[0].data_ = (pointer)unaff_R15;
      local_98[0].cap = 5;
      ClassPropertySymbol::fromSyntax
                (this,(ClassPropertyDeclarationSyntax *)syntax,
                 (SmallVectorBase<const_slang::ast::ClassPropertySymbol_*> *)local_98);
      ppSVar4 = local_98[0].data_;
      puVar15 = &local_98[0].data_;
      syntax = (SyntaxNode *)local_98[0].data_;
      if ((char *)local_98[0].len == (char *)0x0) goto LAB_00861b62;
      lVar17 = local_98[0].len << 3;
      lVar16 = 0;
      do {
        insertMember(this,*(Symbol **)((long)&((Symbol *)ppSVar4)->kind + lVar16),this->lastMember,
                     false,true);
        lVar16 = lVar16 + 8;
        puVar14 = &local_98[0].data_;
      } while (lVar17 != lVar16);
    }
    else {
      if (SVar1 != ParameterDeclarationStatement) {
        compilation = (Compilation *)this;
        if (SVar1 != TypedefDeclaration) {
          return;
        }
        goto switchD_00861040_caseD_83;
      }
      unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
      local_98[0].len = 0;
      local_98[0].data_ = (pointer)unaff_R15;
      local_98[0].cap = 5;
      ParameterSymbolBase::fromLocalSyntax
                (this,(ParameterDeclarationStatementSyntax *)syntax[5].previewNode,
                 (SmallVectorBase<slang::ast::Symbol_*> *)local_98);
      ppSVar4 = local_98[0].data_;
      syntax = (SyntaxNode *)local_98[0].data_;
      if ((char *)local_98[0].len == (char *)0x0) goto LAB_00861b62;
      lVar17 = local_98[0].len << 3;
      lVar16 = 0;
      do {
        insertMember(this,*(Symbol **)((long)&((Symbol *)ppSVar4)->kind + lVar16),this->lastMember,
                     false,true);
        lVar16 = lVar16 + 8;
        puVar14 = &local_98[0].data_;
      } while (lVar17 != lVar16);
    }
    break;
  case 0x57:
    member = (ConfigBlockSymbol *)
             ProceduralBlockSymbol::fromSyntax(this,(ConcurrentAssertionMemberSyntax *)syntax);
    goto LAB_00861182;
  case 0x5a:
    member = (ConfigBlockSymbol *)
             TimingPathSymbol::fromSyntax(this,(ConditionalPathDeclarationSyntax *)syntax);
    goto LAB_00861182;
  case 0x60:
    member = Compilation::createConfigBlock
                       (this->compilation,this,(ConfigDeclarationSyntax *)syntax);
    goto LAB_00861182;
  case 0x65:
    member = (ConfigBlockSymbol *)
             ConstraintBlockSymbol::fromSyntax(this,(ConstraintDeclarationSyntax *)syntax);
LAB_00861baf:
    if (member == (ConfigBlockSymbol *)0x0) {
      return;
    }
    goto LAB_00861182;
  case 0x66:
    member = (ConfigBlockSymbol *)
             ConstraintBlockSymbol::fromSyntax(this,(ConstraintPrototypeSyntax *)syntax);
    goto LAB_00861182;
  case 0x6d:
    member = (ConfigBlockSymbol *)CoverageBinSymbol::fromSyntax(this,(CoverageBinsSyntax *)syntax);
    goto LAB_00861182;
  case 0x71:
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_98[0].len;
    local_98[0]._0_16_ = auVar3 << 0x40;
    member_00 = CovergroupType::fromSyntax
                          (this,(CovergroupDeclarationSyntax *)syntax,(Symbol **)local_98);
    insertMember(this,(Symbol *)member_00,this->lastMember,false,true);
    if ((ForwardingTypedefSymbol *)local_98[0].data_ == (ForwardingTypedefSymbol *)0x0) {
      return;
    }
    insertMember(this,(Symbol *)local_98[0].data_,this->lastMember,false,true);
    return;
  case 0x72:
    member = (ConfigBlockSymbol *)CoverpointSymbol::fromSyntax(this,(CoverpointSyntax *)syntax);
    goto LAB_00861182;
  case 0x74:
    Compilation::noteDPIExportDirective(this->compilation,(DPIExportSyntax *)syntax,this);
    return;
  case 0x75:
    member = (ConfigBlockSymbol *)
             SubroutineSymbol::fromSyntax(this->compilation,(DPIImportSyntax *)syntax,this);
    goto LAB_00861182;
  case 0x76:
    if ((((syntax[5].previewNode)->kind == NamedType) && (syntax[5].parent == (SyntaxNode *)0x0)) &&
       (bVar5 = handleDataDeclaration(this,(DataDeclarationSyntax *)syntax), bVar5)) {
      return;
    }
    unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
    local_98[0].len = 0;
    local_98[0].data_ = (pointer)unaff_R15;
    local_98[0].cap = 5;
    VariableSymbol::fromSyntax
              (this->compilation,(DataDeclarationSyntax *)syntax,this,false,
               (SmallVectorBase<slang::ast::VariableSymbol_*> *)local_98);
    unaff_RBX = (Scope *)local_98[0].len;
    syntax = (SyntaxNode *)local_98[0].data_;
    goto code_r0x00861b31;
  case 0x78:
    unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
    local_98[0].len = 0;
    local_98[0].data_ = (pointer)unaff_R15;
    local_98[0].cap = 5;
    DefParamSymbol::fromSyntax
              (this,(DefParamSyntax *)syntax,
               (SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)local_98);
    ppSVar4 = local_98[0].data_;
    puVar15 = &local_98[0].data_;
    syntax = (SyntaxNode *)local_98[0].data_;
    if ((char *)local_98[0].len == (char *)0x0) goto LAB_00861b62;
    lVar17 = local_98[0].len << 3;
    lVar16 = 0;
    do {
      insertMember(this,*(Symbol **)((long)&((Symbol *)ppSVar4)->kind + lVar16),this->lastMember,
                   false,true);
      lVar16 = lVar16 + 8;
      puVar14 = &local_98[0].data_;
    } while (lVar17 != lVar16);
    break;
  case 0x80:
    *in_RDX = *in_RDX + (int)puVar7 +
              (uint)(0xffffffffff5bb90b <
                    (ulong)(long)(int)(&switchD_00861040::switchdataD_00a446f4)[iVar6 - 0x44]);
    goto switchD_008611c4_caseD_145;
  case 0x81:
  case 0x82:
    goto switchD_00861040_caseD_81;
  case 0x83:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x95:
  case 0x96:
  case 0x97:
switchD_00861040_caseD_83:
    member = (ConfigBlockSymbol *)
             TypeAliasType::fromSyntax
                       ((Scope *)compilation,(ClassPropertyDeclarationSyntax *)syntax);
    goto LAB_00861182;
  case 0x84:
    goto code_r0x00861089;
  case 0x8d:
    this_01 = (Token *)((ulong)this & 0xffffffff);
    do {
      local_98[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(this_01);
      SVar10 = parsing::Token::location((Token *)unaff_R13);
      local_58._M_len = (size_t)SVar10;
      this = (Scope *)BumpAllocator::
                      emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                                ((BumpAllocator *)this,
                                 (basic_string_view<char,_std::char_traits<char>_> *)local_98,
                                 (SourceLocation *)&local_58);
      (((ExplicitImportSymbol *)this)->super_Symbol).originatingSyntax = (SyntaxNode *)unaff_RBX;
      Symbol::setAttributes
                ((Symbol *)this,(Scope *)syntax,
                 *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   *)((long)(local_48 + 2) + 0x10));
      psVar11 = &((ExplicitImportSymbol *)this)->importName;
      while( true ) {
        *(bool *)&psVar11->_M_len = true;
        lVar17 = unaff_R12;
switchD_00861040_caseD_93:
        insertMember((Scope *)syntax,(Symbol *)this,(Symbol *)syntax[1].parent,false,true);
        unaff_R12 = lVar17 + 0x30;
        unaff_R15 = (ForwardingTypedefSymbol *)((long)(unaff_R15 + 0xffffffffffffffff) + 0x57);
        if (unaff_R15 == (ForwardingTypedefSymbol *)0x0) {
          return;
        }
        ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)(*(SyntaxNode **)((long)(local_48 + 5) + 0x10) + 2) + lVar17));
        unaff_RBX = (Scope *)*ppSVar9;
        unaff_R13 = unaff_RBX + 1;
        this_01 = (Token *)&unaff_RBX->firstMember;
        this = *(Scope **)syntax;
        if (*(short *)&unaff_RBX[1].compilation == 0x1b) break;
        local_98[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(this_01);
        local_58 = parsing::Token::valueText((Token *)unaff_R13);
        local_40 = parsing::Token::location((Token *)unaff_R13);
        this = (Scope *)BumpAllocator::
                        emplace<slang::ast::ExplicitImportSymbol,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                                  ((BumpAllocator *)this,
                                   (basic_string_view<char,_std::char_traits<char>_> *)local_98,
                                   &local_58,&local_40);
        (((ExplicitImportSymbol *)this)->super_Symbol).originatingSyntax = (SyntaxNode *)unaff_RBX;
        Symbol::setAttributes
                  ((Symbol *)this,(Scope *)syntax,
                   *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                     *)((long)(local_48 + 2) + 0x10));
        psVar11 = (string_view *)&((ExplicitImportSymbol *)this)->isFromExport;
      }
    } while( true );
  case 0x8e:
    pcVar13 = (char *)(ulong)(uint)((int)unaff_RBX << 3);
    goto code_r0x00861286;
  case 0x92:
  case 0x98:
    goto LAB_0086171a;
  case 0x93:
    goto switchD_00861040_caseD_93;
  case 0x94:
switchD_00861040_caseD_94:
    member = (ConfigBlockSymbol *)ElabSystemTaskSymbol::fromSyntax(compilation,syntax_00);
    goto LAB_00861182;
  case 0x99:
  case 0xa0:
    halt_baddata();
  case 0x9a:
    *(int *)&unaff_RBX[0xbbbed].field_0x2c = *(int *)&unaff_RBX[0xbbbed].field_0x2c + -1;
    pcVar13 = (char *)(ulong)(uint)local_98[0].len;
    goto code_r0x0086107c;
  case 0x9b:
  case 0x9d:
  case 0x9e:
  case 0x9f:
code_r0x00861b31:
    puVar15 = &local_98[0].data_;
    if (unaff_RBX == (Scope *)0x0) goto LAB_00861b62;
    lVar17 = 0;
    do {
      insertMember(this,*(Symbol **)
                         ((long)&(((ForwardingTypedefSymbol *)syntax)->super_Symbol).kind + lVar17),
                   this->lastMember,false,true);
      lVar17 = lVar17 + 8;
      puVar14 = &local_98[0].data_;
    } while ((long)unaff_RBX * 8 != lVar17);
    break;
  case 0x9c:
    goto switchD_008611c4_caseD_142;
  case 0xa1:
    *(char *)puVar7 = (char)*puVar7 + (char)puVar7;
    goto code_r0x00860fdf;
  case 0xa2:
    do {
      uRamfffffffffffffff8 = 0x861a15;
      insertMember(this,*(Symbol **)(unaff_R12 + (long)&syntax->kind),this->lastMember,false,true);
      unaff_R12 = unaff_R12 + 8;
      puVar14 = (undefined8 *)(undefined1 *)0x0;
    } while (unaff_RBX != (Scope *)unaff_R12);
    break;
  case 0xa3:
    do {
      this_00 = BumpAllocator::
                emplace<slang::ast::ExplicitImportSymbol,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                          (&local_38->super_BumpAllocator,
                           (basic_string_view<char,_std::char_traits<char>_> *)local_98,&local_58,
                           &local_40);
      (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)this;
      Symbol::setAttributes
                (&this_00->super_Symbol,unaff_RBX,
                 *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   *)&syntax[2].previewNode);
      insertMember(unaff_RBX,&this_00->super_Symbol,unaff_RBX->lastMember,false,true);
      lVar17 = unaff_R12;
      while( true ) {
        unaff_R12 = lVar17 + 0x30;
        unaff_R13 = (Scope *)((long)&unaff_R13[-1].importData + 7);
        if (unaff_R13 == (Scope *)0x0) {
          return;
        }
        ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             (lVar17 + (long)&syntax[5].previewNode[2].kind));
        this = (Scope *)*ppSVar9;
        if ((((PackageImportItemSyntax *)this)->item).kind != Star) break;
        addWildcardImport(unaff_RBX,(PackageImportItemSyntax *)this,
                          *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                            *)&syntax[2].previewNode);
        lVar17 = unaff_R12;
      }
      local_38 = unaff_RBX->compilation;
      local_98[0]._0_16_ =
           (undefined1  [16])parsing::Token::valueText(&((PackageImportItemSyntax *)this)->package);
      local_58 = parsing::Token::valueText(&((PackageImportItemSyntax *)this)->item);
      local_40 = parsing::Token::location(&((PackageImportItemSyntax *)this)->item);
    } while( true );
  }
LAB_00861b5e:
  puVar15 = puVar14;
  syntax = (SyntaxNode *)*puVar14;
LAB_00861b62:
  if ((ForwardingTypedefSymbol *)syntax != unaff_R15) {
    *(undefined8 *)((long)puVar15 + -8) = 0x861b6f;
    operator_delete(syntax);
  }
  return;
}

Assistant:

void Scope::addMembers(const SyntaxNode& syntax) {
    if (syntax.previewNode)
        addMembers(*syntax.previewNode);

    switch (syntax.kind) {
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ProgramDeclaration: {
            // Definitions exist in their own namespace and are tracked in the Compilation.
            LookupLocation ll(this, lastMember ? uint32_t(lastMember->getIndex()) + 1 : 1);
            compilation.createDefinition(*this, ll, syntax.as<ModuleDeclarationSyntax>());

            if (thisSym->kind != SymbolKind::Root && thisSym->kind != SymbolKind::CompilationUnit &&
                syntax.kind != SyntaxKind::InterfaceDeclaration) {
                addDeferredMembers(syntax);
            }
            break;
        }
        case SyntaxKind::PackageDeclaration: {
            // Packages exist in their own namespace and are tracked in the Compilation.
            auto& package = compilation.createPackage(*this, syntax.as<ModuleDeclarationSyntax>());
            addMember(package);
            break;
        }
        case SyntaxKind::UdpDeclaration:
            // Primitives exist in their own namespace and are tracked in the Compilation.
            compilation.createPrimitive(*this, syntax.as<UdpDeclarationSyntax>());
            break;
        case SyntaxKind::ConfigDeclaration:
            // Config blocks exist in their own namespace and are tracked in the Compilation.
            addMember(compilation.createConfigBlock(*this, syntax.as<ConfigDeclarationSyntax>()));
            break;
        case SyntaxKind::PackageImportDeclaration: {
            auto& importDecl = syntax.as<PackageImportDeclarationSyntax>();
            for (auto item : importDecl.items) {
                if (item->item.kind == TokenKind::Star) {
                    addWildcardImport(*item, importDecl.attributes);
                }
                else {
                    auto import = compilation.emplace<ExplicitImportSymbol>(
                        item->package.valueText(), item->item.valueText(), item->item.location());

                    import->setSyntax(*item);
                    import->setAttributes(*this, importDecl.attributes);
                    addMember(*import);
                }
            }
            break;
        }
        case SyntaxKind::PackageExportDeclaration: {
            auto& exportDecl = syntax.as<PackageExportDeclarationSyntax>();
            for (auto item : exportDecl.items) {
                if (item->item.kind == TokenKind::Star) {
                    // These are handled manually as "wildcard imports" but don't get
                    // added to the import list. This is done just so that the package
                    // name itself gets validated and the attributes have somewhere to live.
                    // The actual export functionality is handled in PackageSymbol.
                    auto import = compilation.emplace<WildcardImportSymbol>(
                        item->package.valueText(), item->item.location());

                    import->setSyntax(*item);
                    import->setAttributes(*this, exportDecl.attributes);
                    import->isFromExport = true;
                    addMember(*import);
                }
                else {
                    auto import = compilation.emplace<ExplicitImportSymbol>(
                        item->package.valueText(), item->item.valueText(), item->item.location());

                    import->setSyntax(*item);
                    import->setAttributes(*this, exportDecl.attributes);
                    import->isFromExport = true;
                    addMember(*import);
                }
            }
            break;
        }
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::PrimitiveInstantiation:
        case SyntaxKind::CheckerInstantiation:
        case SyntaxKind::AnsiPortList:
        case SyntaxKind::NonAnsiPortList:
        case SyntaxKind::IfGenerate:
        case SyntaxKind::CaseGenerate:
        case SyntaxKind::LoopGenerate:
        case SyntaxKind::GenerateBlock:
        case SyntaxKind::ContinuousAssign:
        case SyntaxKind::ModportDeclaration:
        case SyntaxKind::ClockingItem:
        case SyntaxKind::DefaultClockingReference:
        case SyntaxKind::DefaultDisableDeclaration:
        case SyntaxKind::SpecifyBlock:
        case SyntaxKind::CoverCross:
        case SyntaxKind::NetAlias:
        case SyntaxKind::BindDirective:
        case SyntaxKind::ClockingDeclaration:
            addDeferredMembers(syntax);
            break;
        case SyntaxKind::EnumType:
            addDeferredMembers(syntax);
            getOrAddDeferredData().hasEnums = true;
            break;
        case SyntaxKind::PortDeclaration:
            addDeferredMembers(syntax);
            getOrAddDeferredData().addPortDeclaration(syntax, lastMember);
            break;
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::TaskDeclaration: {
            auto [subroutine, isExternIfaceMethod] = SubroutineSymbol::fromSyntax(
                compilation, syntax.as<FunctionDeclarationSyntax>(), *this, /* outOfBlock */ false);

            if (subroutine)
                addMember(*subroutine);

            if (isExternIfaceMethod)
                getOrAddDeferredData().isUncacheable = true;
            break;
        }
        case SyntaxKind::DataDeclaration: {
            // If this declaration has a named type we need to do a lookup here to see if it's
            // actually a user-defined nettype or a non-ansi interface port declaration.
            auto& dataDecl = syntax.as<DataDeclarationSyntax>();
            if (dataDecl.type->kind == SyntaxKind::NamedType && dataDecl.modifiers.empty()) {
                if (handleDataDeclaration(dataDecl))
                    break;
            }

            SmallVector<VariableSymbol*> symbols;
            VariableSymbol::fromSyntax(compilation, dataDecl, *this, /* isCheckerFreeVar */ false,
                                       symbols);
            for (auto symbol : symbols)
                addMember(*symbol);
            break;
        }
        case SyntaxKind::UserDefinedNetDeclaration:
            handleUserDefinedNet(syntax.as<UserDefinedNetDeclarationSyntax>());
            break;
        case SyntaxKind::NetDeclaration: {
            SmallVector<const NetSymbol*> nets;
            NetSymbol::fromSyntax(*this, syntax.as<NetDeclarationSyntax>(), nets);
            for (auto net : nets)
                addMember(*net);
            break;
        }
        case SyntaxKind::CheckerDataDeclaration: {
            SmallVector<VariableSymbol*> symbols;
            VariableSymbol::fromSyntax(compilation, *syntax.as<CheckerDataDeclarationSyntax>().data,
                                       *this, /* isCheckerFreeVar */ true, symbols);
            for (auto symbol : symbols)
                addMember(*symbol);
            break;
        }
        case SyntaxKind::ParameterDeclarationStatement: {
            SmallVector<Symbol*> params;
            ParameterSymbolBase::fromLocalSyntax(*this,
                                                 syntax.as<ParameterDeclarationStatementSyntax>(),
                                                 params);
            for (auto param : params)
                addMember(*param);
            break;
        }
        case SyntaxKind::AlwaysBlock:
        case SyntaxKind::AlwaysCombBlock:
        case SyntaxKind::AlwaysLatchBlock:
        case SyntaxKind::AlwaysFFBlock:
        case SyntaxKind::InitialBlock:
        case SyntaxKind::FinalBlock:
            addMember(ProceduralBlockSymbol::fromSyntax(*this, syntax.as<ProceduralBlockSyntax>()));
            break;
        case SyntaxKind::ConcurrentAssertionMember:
            addMember(ProceduralBlockSymbol::fromSyntax(
                *this, syntax.as<ConcurrentAssertionMemberSyntax>()));
            break;
        case SyntaxKind::ImmediateAssertionMember:
            addMember(ProceduralBlockSymbol::fromSyntax(
                *this, syntax.as<ImmediateAssertionMemberSyntax>()));
            break;
        case SyntaxKind::EmptyMember:
            addMember(
                EmptyMemberSymbol::fromSyntax(compilation, *this, syntax.as<EmptyMemberSyntax>()));
            break;
        case SyntaxKind::TypedefDeclaration:
            addMember(TypeAliasType::fromSyntax(*this, syntax.as<TypedefDeclarationSyntax>()));
            break;
        case SyntaxKind::ForwardTypedefDeclaration: {
            auto& symbol = ForwardingTypedefSymbol::fromSyntax(
                *this, syntax.as<ForwardTypedefDeclarationSyntax>());
            addMember(symbol);
            getOrAddDeferredData().addForwardingTypedef(symbol);
            break;
        }
        case SyntaxKind::GenerateRegion:
            for (auto member : syntax.as<GenerateRegionSyntax>().members)
                addMembers(*member);
            break;
        case SyntaxKind::NetTypeDeclaration:
            addMember(NetType::fromSyntax(*this, syntax.as<NetTypeDeclarationSyntax>()));
            break;
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::PackageExportAllDeclaration:
            // These are handled elsewhere; just ignore here.
            break;
        case SyntaxKind::GenvarDeclaration: {
            SmallVector<const GenvarSymbol*> genvars;
            GenvarSymbol::fromSyntax(*this, syntax.as<GenvarDeclarationSyntax>(), genvars);
            for (auto genvar : genvars)
                addMember(*genvar);
            break;
        }
        case SyntaxKind::ClassDeclaration:
            addMember(ClassType::fromSyntax(*this, syntax.as<ClassDeclarationSyntax>()));
            break;
        case SyntaxKind::ClassPropertyDeclaration: {
            auto& cpd = syntax.as<ClassPropertyDeclarationSyntax>();
            switch (cpd.declaration->kind) {
                case SyntaxKind::DataDeclaration: {
                    SmallVector<const ClassPropertySymbol*> symbols;
                    ClassPropertySymbol::fromSyntax(*this, cpd, symbols);
                    for (auto symbol : symbols)
                        addMember(*symbol);
                    break;
                }
                case SyntaxKind::TypedefDeclaration:
                    addMember(TypeAliasType::fromSyntax(*this, cpd));
                    break;
                case SyntaxKind::ForwardTypedefDeclaration: {
                    auto& symbol = ForwardingTypedefSymbol::fromSyntax(*this, cpd);
                    addMember(symbol);
                    getOrAddDeferredData().addForwardingTypedef(symbol);
                    break;
                }
                case SyntaxKind::ParameterDeclarationStatement: {
                    SmallVector<Symbol*> params;
                    ParameterSymbolBase::fromLocalSyntax(
                        *this, cpd.declaration->as<ParameterDeclarationStatementSyntax>(), params);
                    for (auto param : params)
                        addMember(*param);
                    break;
                }
                default:
                    // All other possible member kinds here are illegal and will
                    // be diagnosed in the parser, so just ignore them.
                    break;
            }
            break;
        }
        case SyntaxKind::ClassMethodDeclaration: {
            // Constructors need to be deferred because they may need to
            // inherit arguments from their base class.
            auto& cmds = syntax.as<ClassMethodDeclarationSyntax>();
            if (cmds.declaration->prototype->name->getLastToken().kind == TokenKind::NewKeyword)
                addDeferredMembers(syntax);
            else if (auto subroutine = SubroutineSymbol::fromSyntax(compilation, cmds, *this))
                addMember(*subroutine);
            break;
        }
        case SyntaxKind::ClassMethodPrototype:
            addMember(
                MethodPrototypeSymbol::fromSyntax(*this, syntax.as<ClassMethodPrototypeSyntax>()));
            break;
        case SyntaxKind::ElabSystemTask:
            addMember(
                ElabSystemTaskSymbol::fromSyntax(compilation, syntax.as<ElabSystemTaskSyntax>()));
            break;
        case SyntaxKind::DPIImport:
            addMember(
                SubroutineSymbol::fromSyntax(compilation, syntax.as<DPIImportSyntax>(), *this));
            break;
        case SyntaxKind::DPIExport:
            compilation.noteDPIExportDirective(syntax.as<DPIExportSyntax>(), *this);
            break;
        case SyntaxKind::ConstraintDeclaration:
            if (auto sym = ConstraintBlockSymbol::fromSyntax(
                    *this, syntax.as<ConstraintDeclarationSyntax>())) {
                addMember(*sym);
            }
            break;
        case SyntaxKind::ConstraintPrototype:
            addMember(
                ConstraintBlockSymbol::fromSyntax(*this, syntax.as<ConstraintPrototypeSyntax>()));
            break;
        case SyntaxKind::DefParam: {
            SmallVector<const DefParamSymbol*> defparams;
            DefParamSymbol::fromSyntax(*this, syntax.as<DefParamSyntax>(), defparams);
            for (auto defparam : defparams)
                addMember(*defparam);
            break;
        }
        case SyntaxKind::SpecparamDeclaration: {
            SmallVector<const SpecparamSymbol*> params;
            SpecparamSymbol::fromSyntax(*this, syntax.as<SpecparamDeclarationSyntax>(), params);
            for (auto param : params)
                addMember(*param);
            break;
        }
        case SyntaxKind::SequenceDeclaration:
            addMember(SequenceSymbol::fromSyntax(*this, syntax.as<SequenceDeclarationSyntax>()));
            break;
        case SyntaxKind::PropertyDeclaration:
            addMember(PropertySymbol::fromSyntax(*this, syntax.as<PropertyDeclarationSyntax>()));
            break;
        case SyntaxKind::LetDeclaration:
            addMember(LetDeclSymbol::fromSyntax(*this, syntax.as<LetDeclarationSyntax>()));
            break;
        case SyntaxKind::CheckerDeclaration:
            addMember(CheckerSymbol::fromSyntax(*this, syntax.as<CheckerDeclarationSyntax>()));
            break;
        case SyntaxKind::CovergroupDeclaration: {
            const Symbol* classProperty = nullptr;
            addMember(CovergroupType::fromSyntax(*this, syntax.as<CovergroupDeclarationSyntax>(),
                                                 classProperty));
            if (classProperty)
                addMember(*classProperty);
            break;
        }
        case SyntaxKind::Coverpoint:
            addMember(CoverpointSymbol::fromSyntax(*this, syntax.as<CoverpointSyntax>()));
            break;
        case SyntaxKind::CoverageBins:
            addMember(CoverageBinSymbol::fromSyntax(*this, syntax.as<CoverageBinsSyntax>()));
            break;
        case SyntaxKind::BinsSelection:
            addMember(CoverageBinSymbol::fromSyntax(*this, syntax.as<BinsSelectionSyntax>()));
            break;
        case SyntaxKind::ExternInterfaceMethod:
            addMember(
                MethodPrototypeSymbol::fromSyntax(*this, syntax.as<ExternInterfaceMethodSyntax>()));
            break;
        case SyntaxKind::PathDeclaration:
            addMember(TimingPathSymbol::fromSyntax(*this, syntax.as<PathDeclarationSyntax>()));
            break;
        case SyntaxKind::IfNonePathDeclaration:
            addMember(
                TimingPathSymbol::fromSyntax(*this, syntax.as<IfNonePathDeclarationSyntax>()));
            break;
        case SyntaxKind::ConditionalPathDeclaration:
            addMember(
                TimingPathSymbol::fromSyntax(*this, syntax.as<ConditionalPathDeclarationSyntax>()));
            break;
        case SyntaxKind::PulseStyleDeclaration:
            addMember(
                PulseStyleSymbol::fromSyntax(*this, syntax.as<PulseStyleDeclarationSyntax>()));
            break;
        case SyntaxKind::SystemTimingCheck:
            addMember(
                SystemTimingCheckSymbol::fromSyntax(*this, syntax.as<SystemTimingCheckSyntax>()));
            break;
        case SyntaxKind::AnonymousProgram:
            addMember(
                AnonymousProgramSymbol::fromSyntax(*this, syntax.as<AnonymousProgramSyntax>()));
            break;
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::ExternUdpDecl:
            compilation.noteExternDefinition(*this, syntax);
            break;
        case SyntaxKind::WildcardPortList:
            // If we hit this case we've run into an error elsewhere.
            // Just silently ignore it here.
            break;
        case SyntaxKind::LibraryDeclaration:
        case SyntaxKind::LibraryIncludeStatement:
            // These are ignored here, they're only processed during
            // library map construction.
            break;
        default:
            SLANG_UNREACHABLE;
    }
}